

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

void __thiscall
kratos::FunctionCallVar::add_sink(FunctionCallVar *this,shared_ptr<kratos::AssignStmt> *stmt)

{
  pointer pcVar1;
  int iVar2;
  _Rb_tree_node_base *p_Var3;
  undefined4 extraout_var;
  Generator *pGVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  const_iterator cVar5;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined1 local_48 [32];
  
  for (p_Var3 = (this->args_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->args_)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    (**(code **)(**(long **)(p_Var3 + 2) + 0xa8))(*(long **)(p_Var3 + 2),stmt);
  }
  iVar2 = (*(this->super_Var).super_IRNode._vptr_IRNode[0xd])(this);
  pGVar4 = Const::const_gen();
  if ((Generator *)CONCAT44(extraout_var,iVar2) == pGVar4) {
    iVar2 = (*(((stmt->super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
               left_->super_IRNode)._vptr_IRNode[0xd])();
    (this->super_Var).generator_ = (Generator *)CONCAT44(extraout_var_00,iVar2);
    iVar2 = (*(this->super_Var).super_IRNode._vptr_IRNode[0xd])(this);
    pcVar1 = (this->func_def_->function_name_)._M_dataplus._M_p;
    local_48._0_8_ = local_48 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,pcVar1,pcVar1 + (this->func_def_->function_name_)._M_string_length
              );
    cVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
                    *)(CONCAT44(extraout_var_01,iVar2) + 0x3b8),(key_type *)local_48);
    if ((undefined1 *)local_48._0_8_ != local_48 + 0x10) {
      operator_delete((void *)local_48._0_8_,local_48._16_8_ + 1);
    }
    if (cVar5._M_node == (_Base_ptr)(CONCAT44(extraout_var_01,iVar2) + 0x3c0)) {
      iVar2 = (*(this->super_Var).super_IRNode._vptr_IRNode[0xd])(this);
      Stmt::as<kratos::FunctionStmtBlock>((Stmt *)local_48);
      Generator::add_function
                ((Generator *)CONCAT44(extraout_var_02,iVar2),
                 (shared_ptr<kratos::FunctionStmtBlock> *)local_48);
      if ((pointer)local_48._8_8_ != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
      }
      iVar2 = (*(this->super_Var).super_IRNode._vptr_IRNode[0xd])(this);
      Var::as<kratos::FunctionCallVar>((Var *)local_48);
      Generator::add_call_var
                ((Generator *)CONCAT44(extraout_var_03,iVar2),
                 (shared_ptr<kratos::FunctionCallVar> *)local_48);
      if ((pointer)local_48._8_8_ != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
      }
    }
  }
  return;
}

Assistant:

void FunctionCallVar::add_sink(const std::shared_ptr<AssignStmt> &stmt) {
    for (auto const &iter : args_) {
        iter.second->add_sink(stmt);
    }
    // FIXME: this is a very hacky fix on constant generators
    if (generator() == Const::const_gen()) {
        // use left hand size of stmt
        generator_ = stmt->left()->generator();
        // change the function def to the new generator
        if (!generator()->has_function(func_def_->function_name())) {
            generator()->add_function(func_def_->as<FunctionStmtBlock>());
            generator()->add_call_var(as<FunctionCallVar>());
        }
    }
}